

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::GetData
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,BufferImplType **pSBTBuffer,
          BindingTable *RaygenShaderBindingTable,BindingTable *MissShaderBindingTable,
          BindingTable *HitShaderBindingTable,BindingTable *CallableShaderBindingTable)

{
  RefCntAutoPtr<Diligent::BufferVkImpl> *this_00;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  RenderDeviceVkImpl *pRVar8;
  long *plVar9;
  BufferImplType *pBVar10;
  uint uVar11;
  long *plVar12;
  char (*Args_1) [21];
  pointer puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  string msg;
  String BuffName;
  string msg_4;
  undefined1 local_e0 [32];
  Uint64 local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  ulong local_98;
  ulong local_90;
  uint local_88;
  undefined4 uStack_84;
  undefined1 local_80 [32];
  BindingTable *local_60;
  BindingTable *local_58;
  BindingTable *local_50;
  BindingTable *local_48;
  BufferImplType **local_40;
  long local_38;
  
  local_58 = MissShaderBindingTable;
  local_50 = HitShaderBindingTable;
  local_48 = CallableShaderBindingTable;
  pRVar8 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  uVar18 = (pRVar8->
           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
           ShaderGroupBaseAlignment;
  local_38 = (long)(this->m_RayGenShaderRecord).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_RayGenShaderRecord).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  uVar11 = uVar18 - (uVar18 >> 1 & 0x55555555);
  uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
  uVar11 = ((uVar11 >> 4) + uVar11 & 0xf0f0f0f) * 0x1010101 >> 0x18;
  uStack_84 = 0;
  local_88 = uVar18;
  if (uVar11 != 1) {
    local_b8._0_4_ = uVar18;
    FormatString<char[12],unsigned_int,char[23]>
              ((string *)local_e0,(Diligent *)"Alignment (",(char (*) [12])&local_b8,
               (uint *)") must be a power of 2",(char (*) [23])HitShaderBindingTable);
    DebugAssertionFailed
              ((Char *)local_e0._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_,CONCAT44(local_e0._20_4_,local_e0._16_4_) + 1);
    }
    local_88 = (uint)local_b8;
  }
  uStack_84 = 0;
  puVar1 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._0_4_ = uVar18;
  local_60 = RaygenShaderBindingTable;
  local_40 = pSBTBuffer;
  if (uVar11 != 1) {
    FormatString<char[12],unsigned_int,char[23]>
              ((string *)local_e0,(Diligent *)"Alignment (",(char (*) [12])&local_b8,
               (uint *)") must be a power of 2",(char (*) [23])HitShaderBindingTable);
    DebugAssertionFailed
              ((Char *)local_e0._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_,CONCAT44(local_e0._20_4_,local_e0._16_4_) + 1);
    }
  }
  local_90 = (ulong)(uint)local_b8;
  puVar13 = (this->m_HitGroupsRecord).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar3 = (this->m_HitGroupsRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = uVar18;
  uVar15 = (uint)local_b8;
  if (uVar11 != 1) {
    local_b8._0_4_ = uVar18;
    FormatString<char[12],unsigned_int,char[23]>
              ((string *)local_e0,(Diligent *)"Alignment (",(char (*) [12])&local_b8,
               (uint *)") must be a power of 2",(char (*) [23])HitShaderBindingTable);
    DebugAssertionFailed
              ((Char *)local_e0._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_,CONCAT44(local_e0._20_4_,local_e0._16_4_) + 1);
    }
    uVar15 = (uint)local_90;
    uVar16 = (uint)local_b8;
  }
  uVar17 = local_88;
  local_98 = (ulong)uVar16;
  puVar4 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8 = (long *)CONCAT44(local_b8._4_4_,uVar18);
  if (uVar11 != 1) {
    FormatString<char[12],unsigned_int,char[23]>
              ((string *)local_e0,(Diligent *)"Alignment (",(char (*) [12])&local_b8,
               (uint *)") must be a power of 2",(char (*) [23])HitShaderBindingTable);
    DebugAssertionFailed
              ((Char *)local_e0._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_,CONCAT44(local_e0._20_4_,local_e0._16_4_) + 1);
    }
    uVar15 = (uint)local_90;
    uVar18 = (uint)local_b8;
    uVar16 = (uint)local_98;
  }
  local_98._0_4_ = uVar16;
  uVar17 = -uVar17 & ((int)local_38 + uVar17) - 1;
  uVar16 = -uVar15 & (uVar15 + ((int)puVar1 - (int)puVar2) + uVar17) - 1;
  uVar11 = -(uint)local_98 & ((uint)local_98 + ((int)puVar13 - (int)puVar3) + uVar16) - 1;
  local_98 = (ulong)uVar11;
  pBVar10 = (this->m_pBuffer).m_pObject;
  uVar14 = (ulong)(-uVar18 & (uVar18 + ((int)puVar4 - (int)puVar5) + uVar11) - 1);
  if ((pBVar10 == (BufferImplType *)0x0) ||
     ((pBVar10->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Size < uVar14)) {
    this_00 = &this->m_pBuffer;
    RefCntAutoPtr<Diligent::BufferVkImpl>::operator=(this_00,(BufferVkImpl *)0x0);
    std::__cxx11::string::string
              ((string *)local_e0,
               (this->
               super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
               ).m_Desc.super_DeviceObjectAttribs.Name,(allocator *)local_80);
    plVar9 = (long *)std::__cxx11::string::append(local_e0);
    local_b8 = &local_a8;
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_a8 = *plVar12;
      lStack_a0 = plVar9[3];
    }
    else {
      local_a8 = *plVar12;
      local_b8 = (long *)*plVar9;
    }
    local_b0 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_,CONCAT44(local_e0._20_4_,local_e0._16_4_) + 1);
    }
    local_e0._24_4_ = 0;
    local_c0 = 1;
    local_e0._0_8_ = local_b8;
    local_e0._20_4_ = 1;
    local_e0._16_4_ = 0x400;
    local_e0._8_8_ = uVar14;
    pRVar8 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                        );
    local_80._0_8_ = this_00->m_pObject;
    Args_1 = (char (*) [21])local_80;
    local_80._8_8_ = this_00;
    RenderDeviceVkImpl::CreateBuffer
              (pRVar8,(BufferDesc *)local_e0,(BufferData *)0x0,(IBuffer **)Args_1);
    uVar7 = local_80._8_8_;
    uVar6 = local_80._0_8_;
    if (((RefCntAutoPtr<Diligent::BufferVkImpl> *)local_80._8_8_ !=
         (RefCntAutoPtr<Diligent::BufferVkImpl> *)0x0) &&
       (*(BufferVkImpl **)local_80._8_8_ != (BufferVkImpl *)local_80._0_8_)) {
      RefCntAutoPtr<Diligent::BufferVkImpl>::Release
                ((RefCntAutoPtr<Diligent::BufferVkImpl> *)local_80._8_8_);
      *(BufferVkImpl **)uVar7 = (BufferVkImpl *)uVar6;
    }
    if (this_00->m_pObject == (BufferVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                ((string *)local_80,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pBuffer != nullptr",Args_1);
      DebugAssertionFailed
                ((Char *)local_80._0_8_,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
                 ,0x1dd);
      if ((BufferVkImpl *)local_80._0_8_ != (BufferVkImpl *)(local_80 + 0x10)) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    pBVar10 = this_00->m_pObject;
    uVar11 = (uint)local_98;
    if (pBVar10 == (BufferImplType *)0x0) {
      return;
    }
  }
  local_98._0_4_ = uVar11;
  *local_40 = pBVar10;
  puVar1 = (this->m_RayGenShaderRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_RayGenShaderRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    puVar13 = (pointer)0x0;
    if (this->m_Changed != false) {
      puVar13 = puVar1;
    }
    local_60->pData = puVar13;
    local_60->Offset = 0;
    local_60->Size = (int)puVar2 - (int)puVar1;
    local_60->Stride = this->m_ShaderRecordStride;
  }
  puVar1 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    puVar13 = (pointer)0x0;
    if (this->m_Changed != false) {
      puVar13 = puVar1;
    }
    local_58->pData = puVar13;
    local_58->Offset = uVar17;
    local_58->Size = (int)puVar2 - (int)puVar1;
    local_58->Stride = this->m_ShaderRecordStride;
  }
  puVar1 = (this->m_HitGroupsRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_HitGroupsRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    puVar13 = (pointer)0x0;
    if (this->m_Changed != false) {
      puVar13 = puVar1;
    }
    local_50->pData = puVar13;
    local_50->Offset = uVar16;
    local_50->Size = (int)puVar2 - (int)puVar1;
    local_50->Stride = this->m_ShaderRecordStride;
  }
  puVar1 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    puVar13 = (pointer)0x0;
    if (this->m_Changed != false) {
      puVar13 = puVar1;
    }
    local_48->pData = puVar13;
    local_48->Offset = (uint)local_98;
    local_48->Size = (int)puVar2 - (int)puVar1;
    local_48->Stride = this->m_ShaderRecordStride;
  }
  this->m_Changed = false;
  return;
}

Assistant:

void GetData(BufferImplType*& pSBTBuffer,
                 BindingTable&    RaygenShaderBindingTable,
                 BindingTable&    MissShaderBindingTable,
                 BindingTable&    HitShaderBindingTable,
                 BindingTable&    CallableShaderBindingTable)
    {
        const Uint32 ShaderGroupBaseAlignment = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupBaseAlignment;

        const auto AlignToLarger = [ShaderGroupBaseAlignment](size_t offset) -> Uint32 {
            return AlignUp(static_cast<Uint32>(offset), ShaderGroupBaseAlignment);
        };

        const Uint32 RayGenOffset          = 0;
        const Uint32 MissShaderOffset      = AlignToLarger(m_RayGenShaderRecord.size());
        const Uint32 HitGroupOffset        = AlignToLarger(MissShaderOffset + m_MissShadersRecord.size());
        const Uint32 CallableShadersOffset = AlignToLarger(HitGroupOffset + m_HitGroupsRecord.size());
        const Uint32 BufSize               = AlignToLarger(CallableShadersOffset + m_CallableShadersRecord.size());

        // Recreate buffer
        if (m_pBuffer == nullptr || m_pBuffer->GetDesc().Size < BufSize)
        {
            m_pBuffer = nullptr;

            String     BuffName = String{this->m_Desc.Name} + " - internal buffer";
            BufferDesc BuffDesc;
            BuffDesc.Name      = BuffName.c_str();
            BuffDesc.Usage     = USAGE_DEFAULT;
            BuffDesc.BindFlags = BIND_RAY_TRACING;
            BuffDesc.Size      = BufSize;

            this->GetDevice()->CreateBuffer(BuffDesc, nullptr, m_pBuffer.template DblPtr<IBuffer>());
            VERIFY_EXPR(m_pBuffer != nullptr);
        }

        if (m_pBuffer == nullptr)
            return; // Something went wrong

        pSBTBuffer = m_pBuffer;

        if (!m_RayGenShaderRecord.empty())
        {
            RaygenShaderBindingTable.pData  = m_Changed ? m_RayGenShaderRecord.data() : nullptr;
            RaygenShaderBindingTable.Offset = RayGenOffset;
            RaygenShaderBindingTable.Size   = static_cast<Uint32>(m_RayGenShaderRecord.size());
            RaygenShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_MissShadersRecord.empty())
        {
            MissShaderBindingTable.pData  = m_Changed ? m_MissShadersRecord.data() : nullptr;
            MissShaderBindingTable.Offset = MissShaderOffset;
            MissShaderBindingTable.Size   = static_cast<Uint32>(m_MissShadersRecord.size());
            MissShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_HitGroupsRecord.empty())
        {
            HitShaderBindingTable.pData  = m_Changed ? m_HitGroupsRecord.data() : nullptr;
            HitShaderBindingTable.Offset = HitGroupOffset;
            HitShaderBindingTable.Size   = static_cast<Uint32>(m_HitGroupsRecord.size());
            HitShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_CallableShadersRecord.empty())
        {
            CallableShaderBindingTable.pData  = m_Changed ? m_CallableShadersRecord.data() : nullptr;
            CallableShaderBindingTable.Offset = CallableShadersOffset;
            CallableShaderBindingTable.Size   = static_cast<Uint32>(m_CallableShadersRecord.size());
            CallableShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        m_Changed = false;
    }